

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O2

void __thiscall PoolResource<128UL,_8UL>::~PoolResource(PoolResource<128UL,_8UL> *this)

{
  long lVar1;
  list<std::byte_*,_std::allocator<std::byte_*>_> *this_00;
  _List_node_base *p_Var2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_allocated_chunks;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<std::byte_*,_std::allocator<std::byte_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    operator_delete(p_Var2[1]._M_next,8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::_List_base<std::byte_*,_std::allocator<std::byte_*>_>::_M_clear
              (&this_00->super__List_base<std::byte_*,_std::allocator<std::byte_*>_>);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~PoolResource()
    {
        for (std::byte* chunk : m_allocated_chunks) {
            std::destroy(chunk, chunk + m_chunk_size_bytes);
            ::operator delete ((void*)chunk, std::align_val_t{ELEM_ALIGN_BYTES});
        }
    }